

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_U_mult_inplace(m256v *LU,m256v *X_inout)

{
  uint uVar1;
  undefined8 in_RSI;
  int *in_RDI;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 uVar2;
  int iVar3;
  uint in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffe4 & 0xffffff;
    if (local_14 < in_RDI[1]) {
      uVar1 = CONCAT13(local_14 < *in_RDI,(int3)in_stack_ffffffffffffffe4);
    }
    in_stack_ffffffffffffffe4 = uVar1;
    if ((char)(in_stack_ffffffffffffffe4 >> 0x18) == '\0') break;
    uVar2 = in_RSI;
    iVar3 = local_14;
    m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
    m256v_mult_row((m256v *)CONCAT44(in_stack_ffffffffffffffe4,iVar3),(int)((ulong)uVar2 >> 0x20),
                   (uint8_t)((ulong)uVar2 >> 0x18));
    local_18 = local_14;
    while (local_18 = local_18 + 1, local_18 < in_RDI[1]) {
      in_stack_ffffffffffffffc8 = in_RSI;
      in_stack_ffffffffffffffd4 = local_18;
      m256v_get_el((m256v *)CONCAT44(local_18,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffffe4,iVar3),
                        (int)((ulong)uVar2 >> 0x20),(uint8_t)((ulong)uVar2 >> 0x18),
                        (m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void MV_GEN_N(_U_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = 0; i < LU->n_col && i < LU->n_row; ++i) {
		MV_GEN_N(_mult_row)(X_inout, i, MV_GEN_N(_get_el)(LU, i, i));
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_inout, j,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, i);
		}
	}
}